

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.cc
# Opt level: O1

void __thiscall tcmalloc::PageHeap::GetLargeSpanStatsLocked(PageHeap *this,LargeSpanStats *result)

{
  _Rb_tree_node_base *p_Var1;
  _Rb_tree_header *p_Var2;
  long lVar3;
  int64_t iVar4;
  int64_t iVar5;
  
  result->spans = 0;
  result->normal_pages = 0;
  result->returned_pages = 0;
  p_Var1 = (this->large_normal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(this->large_normal_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var1 != p_Var2) {
    iVar4 = result->spans;
    iVar5 = result->normal_pages;
    do {
      iVar4 = iVar4 + 1;
      iVar5 = (long)&(p_Var1[1]._M_parent)->_M_color + iVar5;
      result->spans = iVar4;
      result->normal_pages = iVar5;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
    } while ((_Rb_tree_header *)p_Var1 != p_Var2);
  }
  p_Var1 = (this->large_returned_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(this->large_returned_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var1 != p_Var2) {
    lVar3 = result->spans;
    iVar4 = result->returned_pages;
    do {
      lVar3 = lVar3 + 1;
      iVar4 = (long)&(p_Var1[1]._M_parent)->_M_color + iVar4;
      result->returned_pages = iVar4;
      result->spans = lVar3;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
    } while ((_Rb_tree_header *)p_Var1 != p_Var2);
  }
  return;
}

Assistant:

void PageHeap::GetLargeSpanStatsLocked(LargeSpanStats* result) {
  ASSERT(lock_.IsHeld());
  result->spans = 0;
  result->normal_pages = 0;
  result->returned_pages = 0;
  for (SpanSetIter it = large_normal_.begin(); it != large_normal_.end(); ++it) {
    result->normal_pages += it->length;
    result->spans++;
  }
  for (SpanSetIter it = large_returned_.begin(); it != large_returned_.end(); ++it) {
    result->returned_pages += it->length;
    result->spans++;
  }
}